

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O2

bool pstore::operator==(sstring_view<const_char_*> *lhs,sstringview_maker *rhs)

{
  int iVar1;
  bool bVar2;
  
  if (lhs->size_ == (rhs->view_).size_) {
    iVar1 = sstring_view<const_char_*>::compare<(anonymous_namespace)::sstringview_maker>(lhs,rhs);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool operator== (sstring_view<PointerType> const & lhs,
                            StringType const & rhs) noexcept {
        if (string_traits<sstring_view<PointerType>>::length (lhs) !=
            string_traits<StringType>::length (rhs)) {
            return false;
        }
        return lhs.compare (rhs) == 0;
    }